

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O0

void prscmpd(prscxdef *ctx)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *p_00;
  void *p_01;
  uchar *__dest;
  void *pvVar7;
  long in_RDI;
  uchar *newptr;
  uint newsiz;
  uchar *p;
  uint need;
  uchar *word3;
  uchar *word2;
  uchar *word1;
  char *in_stack_ffffffffffffff88;
  void *pvVar8;
  errcxdef *in_stack_ffffffffffffff90;
  void *__src;
  size_t in_stack_ffffffffffffff98;
  errcxdef *in_stack_ffffffffffffffa0;
  
  iVar2 = toknext((tokcxdef *)p);
  if (iVar2 != 0x36) {
    errsigf(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
  }
  pvVar6 = (void *)(in_RDI + 0xd0 + (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 8) + 0x130));
  iVar2 = toknext((tokcxdef *)p);
  if (iVar2 != 0x36) {
    errsigf(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
  }
  p_00 = (void *)(in_RDI + 0xd0 + (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 8) + 0x130));
  iVar2 = toknext((tokcxdef *)p);
  if (iVar2 != 0x36) {
    errsigf(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
  }
  p_01 = (void *)(in_RDI + 0xd0 + (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 8) + 0x130));
  prsnreq((prscxdef *)in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  iVar2 = osrp2(pvVar6);
  iVar3 = osrp2(p_00);
  iVar4 = osrp2(p_01);
  uVar5 = iVar2 + iVar3 + iVar4;
  if ((*(long *)(in_RDI + 0x38) == 0) ||
     (*(long *)(in_RDI + 0x48) - (ulong)*(uint *)(in_RDI + 0x40) < (ulong)uVar5)) {
    uVar1 = *(undefined8 *)(in_RDI + 0x48);
    __dest = mchalo(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                    (char *)in_stack_ffffffffffffff90);
    if (*(long *)(in_RDI + 0x38) != 0) {
      memcpy(__dest,*(void **)(in_RDI + 0x38),*(size_t *)(in_RDI + 0x48));
      free(*(void **)(in_RDI + 0x38));
    }
    *(uchar **)(in_RDI + 0x38) = __dest;
    *(ulong *)(in_RDI + 0x48) = (ulong)((int)uVar1 + uVar5 + 0x100);
  }
  pvVar7 = (void *)(*(long *)(in_RDI + 0x38) + (ulong)*(uint *)(in_RDI + 0x40));
  pvVar8 = pvVar7;
  __src = pvVar6;
  iVar2 = osrp2(pvVar6);
  memcpy(pvVar8,__src,(long)iVar2);
  iVar2 = osrp2(pvVar6);
  pvVar7 = (void *)((long)pvVar7 + (long)iVar2);
  pvVar6 = pvVar7;
  pvVar8 = p_00;
  iVar2 = osrp2(p_00);
  memcpy(pvVar6,pvVar8,(long)iVar2);
  iVar2 = osrp2(p_00);
  iVar3 = osrp2(p_01);
  memcpy((void *)((long)pvVar7 + (long)iVar2),p_01,(long)iVar3);
  osrp2(p_01);
  *(uint *)(in_RDI + 0x40) = uVar5 + *(int *)(in_RDI + 0x40);
  return;
}

Assistant:

static void prscmpd(prscxdef *ctx)
{
    uchar *word1;
    uchar *word2;
    uchar *word3;
    uint   need;
    uchar *p;

    /* get 'word1' */
    if (toknext(ctx->prscxtok) != TOKTSSTRING)
        errsig(ctx->prscxerr, ERR_BADCMPD);
    word1 = ctx->prscxpool + ctx->prscxtok->tokcxcur.tokofs;

    /* get 'word2' */
    if (toknext(ctx->prscxtok) != TOKTSSTRING)
        errsig(ctx->prscxerr, ERR_BADCMPD);
    word2 = ctx->prscxpool + ctx->prscxtok->tokcxcur.tokofs;

    /* get 'resultword' */
    if (toknext(ctx->prscxtok) != TOKTSSTRING)
        errsig(ctx->prscxerr, ERR_BADCMPD);
    word3 = ctx->prscxpool + ctx->prscxtok->tokcxcur.tokofs;

    prsnreq(ctx, TOKTSEM);                 /* statement ends with semicolon */
    
    /* add the new compound word definition */
    need = osrp2(word1) + osrp2(word2) + osrp2(word3);
    if (!ctx->prscxcpp || need > (ctx->prscxcps - ctx->prscxcpf))
    {
        uint   newsiz;
        uchar *newptr;
        
        /* get more storage */
        newsiz = ctx->prscxcps + need + 256;
        newptr = mchalo(ctx->prscxerr, newsiz, "prscmpd");

        /* set up new storage */
        if (ctx->prscxcpp)
        {
            memcpy(newptr, ctx->prscxcpp, (size_t)ctx->prscxcps);
            mchfre(ctx->prscxcpp);
        }
        ctx->prscxcpp = (char *)newptr;
        ctx->prscxcps = newsiz;
    }
    
    /* copy the three parts into the compound word area */
    p = (uchar *)ctx->prscxcpp + ctx->prscxcpf;
    memcpy(p, word1, (size_t)osrp2(word1));
    p += osrp2(word1);
    memcpy(p, word2, (size_t)osrp2(word2));
    p += osrp2(word2);
    memcpy(p, word3, (size_t)osrp2(word3));
    p += osrp2(word3);
    
    ctx->prscxcpf += need;
}